

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O2

QList<int> *
QXkbCommon::possibleKeys
          (QList<int> *__return_storage_ptr__,xkb_state *state,QKeyEvent *event,bool superAsMeta,
          bool hyperAsMeta)

{
  iterator iVar1;
  iterator iVar2;
  QList<QKeyCombination> *__range1;
  long in_FS_OFFSET;
  QArrayDataPointer<QKeyCombination> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
  possibleKeyCombinations((QList<QKeyCombination> *)&local_38,state,event,superAsMeta,hyperAsMeta);
  iVar1 = QList<QKeyCombination>::begin((QList<QKeyCombination> *)&local_38);
  iVar2 = QList<QKeyCombination>::end((QList<QKeyCombination> *)&local_38);
  for (; iVar1.i != iVar2.i; iVar1.i = iVar1.i + 1) {
    QList<int>::append(__return_storage_ptr__,(iVar1.i)->combination);
  }
  QArrayDataPointer<QKeyCombination>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QXkbCommon::possibleKeys(xkb_state *state, const QKeyEvent *event,
                                    bool superAsMeta, bool hyperAsMeta)
{
    QList<int> result;
    auto keyCombinations = possibleKeyCombinations(state, event, superAsMeta, hyperAsMeta);
    for (auto keyCombination : keyCombinations)
        result << keyCombination.toCombined();

    return result;
}